

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

Name __thiscall wasm::WasmBinaryReader::getInlineString(WasmBinaryReader *this,bool requireValid)

{
  bool bVar1;
  allocator<char> local_69;
  string local_68;
  size_t local_48;
  size_t local_40;
  undefined1 auStack_38 [8];
  string_view data;
  uint32_t len;
  bool requireValid_local;
  WasmBinaryReader *this_local;
  
  data._M_str._7_1_ = requireValid;
  data._M_str._0_4_ = getU32LEB(this);
  _auStack_38 = getByteView(this,(ulong)(uint32_t)data._M_str);
  if ((data._M_str._7_1_ & 1) != 0) {
    local_48 = (size_t)auStack_38;
    local_40 = data._M_len;
    bVar1 = String::isUTF8(_auStack_38);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"invalid UTF-8 string",&local_69);
      throwError(this,&local_68);
    }
  }
  wasm::Name::Name((Name *)&this_local,_auStack_38);
  return (IString)(IString)_this_local;
}

Assistant:

Name WasmBinaryReader::getInlineString(bool requireValid) {
  auto len = getU32LEB();
  auto data = getByteView(len);
  if (requireValid && !String::isUTF8(data)) {
    throwError("invalid UTF-8 string");
  }
  return Name(data);
}